

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O1

void __thiscall
QExplicitlySharedDataPointer<QEventPointPrivate>::detach_helper
          (QExplicitlySharedDataPointer<QEventPointPrivate> *this)

{
  QEventPointPrivate *pQVar1;
  Data *pDVar2;
  QEventPointPrivate *pQVar3;
  
  pQVar3 = (QEventPointPrivate *)operator_new(0xe0);
  pQVar1 = (this->d).ptr;
  (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  pQVar3->device = pQVar1->device;
  pDVar2 = (pQVar1->window).wp.d;
  (pQVar3->window).wp.d = pDVar2;
  (pQVar3->window).wp.value = (pQVar1->window).wp.value;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar2 = (pQVar1->target).wp.d;
  (pQVar3->target).wp.d = pDVar2;
  (pQVar3->target).wp.value = (pQVar1->target).wp.value;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  memcpy(&pQVar3->pos,&pQVar1->pos,0xae);
  LOCK();
  (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if (((__int_type)
       (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int> == 0) &&
     (pQVar1 = (this->d).ptr, pQVar1 != (QEventPointPrivate *)0x0)) {
    pDVar2 = (pQVar1->target).wp.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
           (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pDVar2->weakref)._q_value.super___atomic_base<int>._M_i == 0) &&
         (pDVar2 = (pQVar1->target).wp.d, pDVar2 != (Data *)0x0)) {
        operator_delete(pDVar2);
      }
    }
    pDVar2 = (pQVar1->window).wp.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
           (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pDVar2->weakref)._q_value.super___atomic_base<int>._M_i == 0) &&
         (pDVar2 = (pQVar1->window).wp.d, pDVar2 != (Data *)0x0)) {
        operator_delete(pDVar2);
      }
    }
    operator_delete(pQVar1,0xe0);
  }
  (this->d).ptr = pQVar3;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QExplicitlySharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d->ref.deref())
        delete d.get();
    d.reset(x);
}